

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O3

void QIntC::range_check_error<long_long>(longlong *cur,longlong *delta)

{
  ulong uVar1;
  ostream *poVar2;
  range_error *prVar3;
  ostringstream msg;
  locale alStack_1c8 [8];
  string local_1c0 [32];
  locale local_1a0 [8];
  ostringstream local_198 [376];
  
  uVar1 = *delta;
  if ((long)uVar1 < 1) {
    if (((long)uVar1 < 0) && ((long)uVar1 < -0x8000000000000000 - *cur)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::locale::classic();
      std::ios::imbue(alStack_1c8);
      std::locale::~locale(alStack_1c8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"adding ",7);
      poVar2 = std::ostream::_M_insert<long_long>((longlong)local_198);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
      poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2," would cause an integer underflow",0x21);
      prVar3 = (range_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::range_error::range_error(prVar3,local_1c0);
      __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
    }
  }
  else if (0x7fffffffffffffffU - *cur < uVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::locale::classic();
    std::ios::imbue(local_1a0);
    std::locale::~locale(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"adding ",7);
    poVar2 = std::ostream::_M_insert<long_long>((longlong)local_198);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," to ",4);
    poVar2 = std::ostream::_M_insert<long_long>((longlong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2," would cause an integer overflow",0x20);
    prVar3 = (range_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::range_error::range_error(prVar3,local_1c0);
    __cxa_throw(prVar3,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  return;
}

Assistant:

void
    range_check_error(T const& cur, T const& delta)
    {
        if ((delta > 0) && ((std::numeric_limits<T>::max() - cur) < delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer overflow";
            throw std::range_error(msg.str());
        } else if ((delta < 0) && ((std::numeric_limits<T>::min() - cur) > delta)) {
            std::ostringstream msg;
            msg.imbue(std::locale::classic());
            msg << "adding " << delta << " to " << cur << " would cause an integer underflow";
            throw std::range_error(msg.str());
        }
    }